

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

tuple<absl::CommandLineFlag_*,_bool>
absl::flags_internal::anon_unknown_0::LocateFlag(string_view flag_name)

{
  CommandLineFlag *pCVar1;
  undefined1 uVar2;
  bool bVar3;
  short *in_RDX;
  undefined8 extraout_RDX;
  absl *this;
  undefined1 *puVar4;
  tuple<absl::CommandLineFlag_*,_bool> tVar5;
  string_view name;
  string_view name_00;
  CommandLineFlag *extraout_RDX_00;
  
  this = (absl *)flag_name._M_str;
  puVar4 = (undefined1 *)flag_name._M_len;
  name._M_str = (char *)in_RDX;
  name._M_len = (size_t)in_RDX;
  pCVar1 = FindCommandLineFlag(this,name);
  bVar3 = this < (absl *)0x2 || pCVar1 != (CommandLineFlag *)0x0;
  name_00._M_str = (CommandLineFlag *)CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar3);
  if ((bVar3) || (*in_RDX != 0x6f6e)) {
    uVar2 = 0;
  }
  else {
    name_00._M_len = (size_t)(in_RDX + 1);
    pCVar1 = FindCommandLineFlag(this + -2,name_00);
    uVar2 = 1;
    name_00._M_str = extraout_RDX_00;
  }
  *puVar4 = uVar2;
  *(CommandLineFlag **)(puVar4 + 8) = pCVar1;
  tVar5.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>.
  super__Head_base<0UL,_absl::CommandLineFlag_*,_false>._M_head_impl = name_00._M_str;
  tVar5.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>._0_8_ = puVar4;
  return (tuple<absl::CommandLineFlag_*,_bool>)
         tVar5.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>;
}

Assistant:

std::tuple<CommandLineFlag*, bool> LocateFlag(absl::string_view flag_name) {
  CommandLineFlag* flag = absl::FindCommandLineFlag(flag_name);
  bool is_negative = false;

  if (!flag && absl::ConsumePrefix(&flag_name, "no")) {
    flag = absl::FindCommandLineFlag(flag_name);
    is_negative = true;
  }

  return std::make_tuple(flag, is_negative);
}